

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O0

void copy_objects_undo_proc(Am_Object *command_obj)

{
  Am_Value *pAVar1;
  Am_Object local_70;
  Am_Value_List local_68;
  Am_Object local_58;
  byte local_49;
  bool currently_undone;
  Am_Object local_40 [3];
  undefined1 local_28 [8];
  Am_Value_List copied_objs;
  Am_Object selection_widget;
  Am_Object *command_obj_local;
  
  Am_Object::Am_Object((Am_Object *)&copied_objs.item);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_28);
  Am_Object::Am_Object((Am_Object *)&stack0xffffffffffffffb8,command_obj);
  Am_Get_Selection_Widget_For_Command(local_40);
  Am_Object::operator=((Am_Object *)&copied_objs.item,local_40);
  Am_Object::~Am_Object(local_40);
  Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffffb8);
  pAVar1 = Am_Object::Get(command_obj,0x16d,0);
  Am_Value_List::operator=((Am_Value_List *)local_28,pAVar1);
  pAVar1 = Am_Object::Get(command_obj,0x16f,0);
  local_49 = Am_Value::operator_cast_to_bool(pAVar1);
  if ((bool)local_49) {
    Am_Object::Am_Object(&local_58,command_obj);
    Am_Value_List::Am_Value_List(&local_68,(Am_Value_List *)local_28);
    copy_objects_into_clipboard(&local_58,&local_68);
    Am_Value_List::~Am_Value_List(&local_68);
    Am_Object::~Am_Object(&local_58);
  }
  else {
    Am_Object::Am_Object(&local_70,command_obj);
    restore_old_clipboard_objs(&local_70);
    Am_Object::~Am_Object(&local_70);
  }
  Am_Object::Set(command_obj,0x16f,(bool)(~local_49 & 1),0);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_28);
  Am_Object::~Am_Object((Am_Object *)&copied_objs.item);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, copy_objects_undo,
                 (Am_Object command_obj))
{
  Am_Object selection_widget;
  Am_Value_List copied_objs;
  selection_widget = Am_Get_Selection_Widget_For_Command(command_obj);
  copied_objs = command_obj.Get(Am_OBJECT_MODIFIED);
  bool currently_undone = command_obj.Get(Am_HAS_BEEN_UNDONE);

  if (currently_undone) { // then redo = reset the clipboard
    copy_objects_into_clipboard(command_obj, copied_objs);
  } else // restore clipboard
    restore_old_clipboard_objs(command_obj);
  command_obj.Set(Am_HAS_BEEN_UNDONE, !currently_undone);
}